

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O1

int __thiscall deqp::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  GLSLVersion GVar2;
  BufferMode BVar3;
  Context *pCVar4;
  int iVar5;
  _Alloc_hider _Var6;
  uint uVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  TestNode *pTVar9;
  char *pcVar10;
  anon_struct_16_2_f7718127 *paVar11;
  long *plVar12;
  UniformBlockCase *pUVar13;
  long lVar14;
  TestNode *pTVar15;
  anon_struct_16_2_f7718127 *paVar16;
  long *plVar17;
  size_type *psVar18;
  int isArray;
  uint uVar19;
  int iVar20;
  long lVar21;
  bool bVar22;
  VarType local_150;
  long lStack_138;
  TestNode *local_130;
  string name;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  anon_struct_16_2_f7718127 *local_b8;
  long local_b0;
  anon_struct_16_2_f7718127 *local_a8;
  allocator<char> local_99;
  VarType local_98;
  long lStack_80;
  TestNode *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long local_50;
  VarType local_48;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  local_78 = pTVar8;
  do {
    pTVar8 = local_78;
    pTVar9 = (TestNode *)operator_new(0x70);
    local_50 = lVar21;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[lVar21].name,glcts::fixed_sample_locations_values + 1);
    paVar16 = init::layoutFlags + lVar21;
    tcu::TestNode::addChild(pTVar8,pTVar9);
    lVar21 = 0;
    local_b8 = paVar16;
    do {
      DVar1 = init::basicTypes[lVar21];
      pcVar10 = glu::getDataTypeName(DVar1);
      uVar19 = ((uint)lVar21 & 1) * 0x100 + 0x100;
      if ((paVar16->flags & 0x10) == 0) {
        uVar19 = 0x300;
      }
      uVar19 = uVar19 | paVar16->flags;
      local_b0 = lVar21;
      if (DVar1 - TYPE_BOOL < 4) {
        pTVar8 = (TestNode *)operator_new(0xb0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        GVar2 = this->m_glslVersion;
        ub::VarType::VarType((VarType *)&name,DVar1,0);
        BlockBasicTypeCase::BlockBasicTypeCase
                  ((BlockBasicTypeCase *)pTVar8,pCVar4,pcVar10,
                   glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar19,0);
        tcu::TestNode::addChild(pTVar9,pTVar8);
        ub::VarType::~VarType((VarType *)&name);
        paVar16 = local_b8;
      }
      else {
        lVar21 = 8;
        do {
          pTVar15 = (TestNode *)operator_new(0xb0);
          pTVar8 = (TestNode *)(this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,*(char **)((long)&PTR_iterate_0215d7c8 + lVar21),
                     (allocator<char> *)local_70);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar17 = plVar12 + 2;
          if ((long *)*plVar12 == plVar17) {
            local_150.m_data._8_8_ = *plVar17;
            lStack_138 = plVar12[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar17;
            local_150._0_8_ = (long *)*plVar12;
          }
          local_150.m_data.array.elementType = (VarType *)plVar12[1];
          *plVar12 = (long)plVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar18 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar18) {
            name.field_2._M_allocated_capacity = *psVar18;
            name.field_2._8_8_ = plVar12[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar18;
            name._M_dataplus._M_p = (pointer)*plVar12;
          }
          _Var6._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          GVar2 = this->m_glslVersion;
          local_130 = pTVar8;
          ub::VarType::VarType
                    (&local_98,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar21));
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar15,(Context *)local_130,_Var6._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,uVar19,0);
          tcu::TestNode::addChild(pTVar9,pTVar15);
          ub::VarType::~VarType(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          paVar16 = local_b8;
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          lVar21 = lVar21 + 0x10;
        } while (lVar21 != 0x38);
      }
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        paVar11 = (anon_struct_16_2_f7718127 *)0x0;
        do {
          lVar21 = 8;
          local_a8 = paVar11;
          do {
            pTVar8 = (TestNode *)operator_new(0xb0);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_70,init::matrixFlags[(long)paVar11].name,&local_99);
            plVar12 = (long *)std::__cxx11::string::append((char *)local_70);
            local_98._0_8_ = (long)&local_98 + 0x10;
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_98.m_data._8_8_ = *plVar17;
              lStack_80 = plVar12[3];
            }
            else {
              local_98.m_data._8_8_ = *plVar17;
              local_98._0_8_ = (long *)*plVar12;
            }
            local_98.m_data.array.elementType = (VarType *)plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_98);
            local_d8 = &local_c8;
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_c8 = *plVar17;
              lStack_c0 = plVar12[3];
            }
            else {
              local_c8 = *plVar17;
              local_d8 = (long *)*plVar12;
            }
            local_d0 = plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
            local_150._0_8_ = (long)&local_150 + 0x10;
            plVar17 = plVar12 + 2;
            if ((long *)*plVar12 == plVar17) {
              local_150.m_data._8_8_ = *plVar17;
              lStack_138 = plVar12[3];
            }
            else {
              local_150.m_data._8_8_ = *plVar17;
              local_150._0_8_ = (long *)*plVar12;
            }
            local_150.m_data.array.elementType = (VarType *)plVar12[1];
            *plVar12 = (long)plVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar18 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar18) {
              name.field_2._M_allocated_capacity = *psVar18;
              name.field_2._8_8_ = plVar12[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar18;
              name._M_dataplus._M_p = (pointer)*plVar12;
            }
            _Var6._M_p = name._M_dataplus._M_p;
            name._M_string_length = plVar12[1];
            *plVar12 = (long)psVar18;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            GVar2 = this->m_glslVersion;
            local_130 = pTVar8;
            ub::VarType::VarType
                      (&local_48,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar21));
            pTVar8 = local_130;
            BlockBasicTypeCase::BlockBasicTypeCase
                      ((BlockBasicTypeCase *)local_130,pCVar4,_Var6._M_p,
                       glcts::fixed_sample_locations_values + 1,GVar2,&local_48,
                       init::matrixFlags[(long)paVar11].flags | uVar19,0);
            tcu::TestNode::addChild(pTVar9,pTVar8);
            ub::VarType::~VarType(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            paVar16 = local_b8;
            if (local_150._0_8_ != (long)&local_150 + 0x10U) {
              operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
            }
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if (local_98._0_8_ != (long)&local_98 + 0x10U) {
              operator_delete((void *)local_98._0_8_,local_98.m_data._8_8_ + 1);
            }
            if (local_70[0] != (undefined1 *)((long)&((VarType *)local_70)->m_data + 8U)) {
              operator_delete(local_70[0],local_60._0_8_ + 1);
            }
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x38);
          paVar11 = (anon_struct_16_2_f7718127 *)((long)&local_a8->name + 1);
        } while (local_a8 == (anon_struct_16_2_f7718127 *)0x0);
      }
      lVar21 = local_b0 + 1;
    } while (lVar21 != 0x19);
    lVar21 = local_50 + 1;
  } while (lVar21 != 3);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_array","Single basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  local_78 = pTVar8;
  do {
    pTVar8 = (TestNode *)operator_new(0x70);
    local_b0 = lVar21;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[lVar21].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_78,pTVar8);
    paVar16 = (anon_struct_16_2_f7718127 *)0x0;
    local_a8 = init::layoutFlags + lVar21;
    do {
      paVar11 = local_a8;
      DVar1 = init::basicTypes[(long)paVar16];
      pcVar10 = glu::getDataTypeName(DVar1);
      uVar19 = paVar11->flags;
      uVar7 = ((uint)paVar16 & 1) * 0x100 + 0x100;
      if ((uVar19 & 0x10) == 0) {
        uVar7 = 0x300;
      }
      local_b8 = paVar16;
      local_130 = (TestNode *)operator_new(0xb0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType(&local_150,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      ub::VarType::VarType((VarType *)&name,&local_150,3);
      pTVar9 = local_130;
      uVar7 = uVar7 | uVar19;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)local_130,pCVar4,pcVar10,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar7,0);
      tcu::TestNode::addChild(pTVar8,pTVar9);
      ub::VarType::~VarType((VarType *)&name);
      ub::VarType::~VarType(&local_150);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar21 = 0;
        do {
          local_130 = (TestNode *)operator_new(0xb0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,*(char **)((long)&init::matrixFlags[0].name + lVar21),
                     (allocator<char> *)&local_48);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar17 = plVar12 + 2;
          if ((long *)*plVar12 == plVar17) {
            local_150.m_data._8_8_ = *plVar17;
            lStack_138 = plVar12[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar17;
            local_150._0_8_ = (long *)*plVar12;
          }
          local_150.m_data.array.elementType = (VarType *)plVar12[1];
          *plVar12 = (long)plVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar18 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar18) {
            name.field_2._M_allocated_capacity = *psVar18;
            name.field_2._8_8_ = plVar12[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar18;
            name._M_dataplus._M_p = (pointer)*plVar12;
          }
          _Var6._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType((VarType *)local_70,DVar1,4);
          ub::VarType::VarType(&local_98,(VarType *)local_70,3);
          pTVar9 = local_130;
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)local_130,pCVar4,_Var6._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,
                     *(uint *)((long)&init::matrixFlags[0].flags + lVar21) | uVar7,0);
          tcu::TestNode::addChild(pTVar8,pTVar9);
          ub::VarType::~VarType(&local_98);
          ub::VarType::~VarType((VarType *)local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          lVar21 = lVar21 + 0x10;
        } while (lVar21 == 0x10);
      }
      paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_b8->name + 1);
    } while (paVar16 != (anon_struct_16_2_f7718127 *)0x19);
    lVar21 = local_b0 + 1;
  } while (lVar21 != 3);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pcVar10 = init::bufferModes[lVar21].name;
    lVar14 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar14);
      iVar20 = 0;
      do {
        pTVar9 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar10,(allocator<char> *)&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_150.m_data._8_8_ = *plVar17;
          lStack_138 = plVar12[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar17;
          local_150._0_8_ = (long *)*plVar12;
        }
        local_150.m_data.array.elementType = (VarType *)plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          name.field_2._M_allocated_capacity = *psVar18;
          name.field_2._8_8_ = plVar12[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar18;
          name._M_dataplus._M_p = (pointer)*plVar12;
        }
        name._M_string_length = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar19 = *(uint *)&pTVar9->m_testCtx;
        BVar3 = init::bufferModes[lVar21].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar20 != 0) {
          if (iVar20 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar13 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215d900;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar19 & 0x10) == 0) << 9 | uVar19 | 0x100;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(iVar20 != 0) * 3;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar13);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 == 1);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    bVar22 = lVar21 == 0;
    lVar21 = lVar21 + 1;
  } while (bVar22);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pcVar10 = init::bufferModes[lVar21].name;
    lVar14 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar14);
      iVar20 = 0;
      do {
        pTVar9 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar10,(allocator<char> *)&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_150.m_data._8_8_ = *plVar17;
          lStack_138 = plVar12[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar17;
          local_150._0_8_ = (long *)*plVar12;
        }
        local_150.m_data.array.elementType = (VarType *)plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          name.field_2._M_allocated_capacity = *psVar18;
          name.field_2._8_8_ = plVar12[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar18;
          name._M_dataplus._M_p = (pointer)*plVar12;
        }
        name._M_string_length = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar19 = *(uint *)&pTVar9->m_testCtx;
        BVar3 = init::bufferModes[lVar21].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar20 != 0) {
          if (iVar20 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar13 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215d950;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar19 & 0x10) == 0) << 8 | uVar19 | 0x200;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(iVar20 != 0) * 3;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar13);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 == 1);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    bVar22 = lVar21 == 0;
    lVar21 = lVar21 + 1;
  } while (bVar22);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct","Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pcVar10 = init::bufferModes[lVar21].name;
    lVar14 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar14);
      iVar20 = 0;
      do {
        pTVar9 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar10,(allocator<char> *)&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_150.m_data._8_8_ = *plVar17;
          lStack_138 = plVar12[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar17;
          local_150._0_8_ = (long *)*plVar12;
        }
        local_150.m_data.array.elementType = (VarType *)plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          name.field_2._M_allocated_capacity = *psVar18;
          name.field_2._8_8_ = plVar12[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar18;
          name._M_dataplus._M_p = (pointer)*plVar12;
        }
        name._M_string_length = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar19 = *(uint *)&pTVar9->m_testCtx;
        BVar3 = init::bufferModes[lVar21].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar20 != 0) {
          if (iVar20 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar13 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215d9a0;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar19 & 0x10) == 0) << 9 | uVar19 | 0x100;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(iVar20 != 0) * 3;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar13);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 == 1);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    bVar22 = lVar21 == 0;
    lVar21 = lVar21 + 1;
  } while (bVar22);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct_array","Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pcVar10 = init::bufferModes[lVar21].name;
    lVar14 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar14);
      iVar20 = 0;
      do {
        pTVar9 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar10,(allocator<char> *)&local_98);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar17 = plVar12 + 2;
        if ((long *)*plVar12 == plVar17) {
          local_150.m_data._8_8_ = *plVar17;
          lStack_138 = plVar12[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar17;
          local_150._0_8_ = (long *)*plVar12;
        }
        local_150.m_data.array.elementType = (VarType *)plVar12[1];
        *plVar12 = (long)plVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar18 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar18) {
          name.field_2._M_allocated_capacity = *psVar18;
          name.field_2._8_8_ = plVar12[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar18;
          name._M_dataplus._M_p = (pointer)*plVar12;
        }
        name._M_string_length = plVar12[1];
        *plVar12 = (long)psVar18;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar19 = *(uint *)&pTVar9->m_testCtx;
        BVar3 = init::bufferModes[lVar21].mode;
        if (BVar3 != BUFFERMODE_SINGLE || iVar20 != 0) {
          if (iVar20 != 0) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar13 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215d9f0;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar19 & 0x10) == 0) << 8 | uVar19 | 0x200;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(iVar20 != 0) * 3;
          tcu::TestNode::addChild(pTVar8,(TestNode *)pUVar13);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 == 1);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    bVar22 = lVar21 == 0;
    lVar21 = lVar21 + 1;
  } while (bVar22);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instance_array_basic_type","Single basic variable in instance array");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  local_78 = pTVar8;
  do {
    pTVar8 = local_78;
    pTVar9 = (TestNode *)operator_new(0x70);
    local_b0 = lVar21;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[lVar21].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar8,pTVar9);
    paVar16 = (anon_struct_16_2_f7718127 *)0x0;
    local_a8 = init::layoutFlags + lVar21;
    do {
      paVar11 = local_a8;
      DVar1 = init::basicTypes[(long)paVar16];
      pcVar10 = glu::getDataTypeName(DVar1);
      uVar19 = paVar11->flags;
      uVar7 = ((uint)paVar16 & 1) * 0x100 + 0x100;
      if ((uVar19 & 0x10) == 0) {
        uVar7 = 0x300;
      }
      local_b8 = paVar16;
      local_130 = (TestNode *)operator_new(0xb0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType((VarType *)&name,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      pTVar8 = local_130;
      uVar7 = uVar7 | uVar19;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)local_130,pCVar4,pcVar10,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar7,3);
      tcu::TestNode::addChild(pTVar9,pTVar8);
      ub::VarType::~VarType((VarType *)&name);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        pTVar8 = (TestNode *)0x0;
        do {
          pTVar15 = (TestNode *)operator_new(0xb0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,
                     (char *)pTVar8[0x4c437].m_name.field_2._M_allocated_capacity,
                     (allocator<char> *)local_70);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar17 = plVar12 + 2;
          if ((long *)*plVar12 == plVar17) {
            local_150.m_data._8_8_ = *plVar17;
            lStack_138 = plVar12[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar17;
            local_150._0_8_ = (long *)*plVar12;
          }
          local_150.m_data.array.elementType = (VarType *)plVar12[1];
          *plVar12 = (long)plVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar18 = (size_type *)(plVar12 + 2);
          if ((size_type *)*plVar12 == psVar18) {
            name.field_2._M_allocated_capacity = *psVar18;
            name.field_2._8_8_ = plVar12[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar18;
            name._M_dataplus._M_p = (pointer)*plVar12;
          }
          _Var6._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar12[1];
          *plVar12 = (long)psVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          GVar2 = this->m_glslVersion;
          local_130 = pTVar8;
          ub::VarType::VarType(&local_98,DVar1,4);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar15,pCVar4,_Var6._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,
                     *(uint *)((long)&local_130[0x4c437].m_name.field_2 + 8) | uVar7,3);
          tcu::TestNode::addChild(pTVar9,pTVar15);
          ub::VarType::~VarType(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar8 = local_130;
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          pTVar8 = (TestNode *)&pTVar8->m_name;
        } while (pTVar8 == (TestNode *)0x10);
      }
      paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_b8->name + 1);
    } while (paVar16 != (anon_struct_16_2_f7718127 *)0x19);
    lVar21 = local_b0 + 1;
  } while (lVar21 != 3);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_basic_types","Multiple buffers with basic types");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pTVar9 = (TestNode *)operator_new(0x70);
    local_b0 = lVar21;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar21].name,glcts::fixed_sample_locations_values + 1);
    local_b8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar21);
    tcu::TestNode::addChild(pTVar8,pTVar9);
    paVar16 = (anon_struct_16_2_f7718127 *)0x0;
    do {
      pcVar10 = init::layoutFlags[(long)paVar16].name;
      iVar20 = 1;
      local_a8 = paVar16;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar10,(allocator<char> *)&local_150);
        local_130 = (TestNode *)CONCAT44(local_130._4_4_,init::layoutFlags[(long)paVar16].flags);
        if (iVar20 != 1) {
          std::__cxx11::string::append((char *)&name);
        }
        pUVar13 = (UniformBlockCase *)operator_new(0xc0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_150._0_8_ = (long)&local_150 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_150);
        BVar3 = local_b8->flags;
        UniformBlockCase::UniformBlockCase
                  (pUVar13,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1,
                   this->m_glslVersion,BVar3);
        iVar5 = (uint)(iVar20 != 1) * 3;
        (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0215da40;
        *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (uint)local_130 | 0x100;
        *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
             = (uint)local_130 | 0x200;
        *(int *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar13);
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (((ulong)local_130 & 0x10) == 0) {
          pUVar13 = (UniformBlockCase *)operator_new(0xc0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          local_150._0_8_ = (long)&local_150 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_150);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1
                     ,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215da40;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_130 | 0x300;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)local_130 | 0x300;
          *(int *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar5;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar13);
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + -1;
      } while (iVar20 == 0);
      paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_a8->name + 1);
    } while (paVar16 != (anon_struct_16_2_f7718127 *)0x3);
    lVar21 = local_b0 + 1;
  } while (local_b0 == 0);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_nested_struct","Multiple buffers with nested structs");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar21 = 0;
  do {
    pTVar9 = (TestNode *)operator_new(0x70);
    local_b0 = lVar21;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar21].name,glcts::fixed_sample_locations_values + 1);
    local_b8 = (anon_struct_16_2_f7718127 *)(init::bufferModes + lVar21);
    tcu::TestNode::addChild(pTVar8,pTVar9);
    paVar16 = (anon_struct_16_2_f7718127 *)0x0;
    do {
      pcVar10 = init::layoutFlags[(long)paVar16].name;
      iVar20 = 1;
      local_a8 = paVar16;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar10,(allocator<char> *)&local_150);
        local_130 = (TestNode *)CONCAT44(local_130._4_4_,init::layoutFlags[(long)paVar16].flags);
        if (iVar20 != 1) {
          std::__cxx11::string::append((char *)&name);
        }
        pUVar13 = (UniformBlockCase *)operator_new(0xc0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_150._0_8_ = (long)&local_150 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_150);
        BVar3 = local_b8->flags;
        UniformBlockCase::UniformBlockCase
                  (pUVar13,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1,
                   this->m_glslVersion,BVar3);
        iVar5 = (uint)(iVar20 != 1) * 3;
        (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0215da90;
        *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (uint)local_130 | 0x100;
        *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
             = (uint)local_130 | 0x200;
        *(int *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar5;
        tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar13);
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (((ulong)local_130 & 0x10) == 0) {
          pUVar13 = (UniformBlockCase *)operator_new(0xc0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          local_150._0_8_ = (long)&local_150 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_150);
          UniformBlockCase::UniformBlockCase
                    (pUVar13,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1
                     ,this->m_glslVersion,BVar3);
          (pUVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0215da90;
          *(uint *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)local_130 | 0x300;
          *(uint *)((long)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)local_130 | 0x300;
          *(int *)&pUVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar5;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pUVar13);
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar20 = iVar20 + -1;
      } while (iVar20 == 0);
      paVar16 = (anon_struct_16_2_f7718127 *)((long)&local_a8->name + 1);
    } while (paVar16 != (anon_struct_16_2_f7718127 *)0x3);
    lVar21 = local_b0 + 1;
  } while (local_b0 == 0);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x3fc0,
             10,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x3fc1,10,0x19);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc3,10
             ,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc7,10,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fe3,10,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fcb,10,
             100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fcf,10,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7feb,10,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x7fef,10,0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0xffffffff,0x14,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar8,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",this->m_glslVersion,BUFFERMODE_SINGLE,0xffffffff,
             0x14,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init(void)
{
	static const glu::DataType basicTypes[] = { glu::TYPE_FLOAT,		glu::TYPE_FLOAT_VEC2,   glu::TYPE_FLOAT_VEC3,
												glu::TYPE_FLOAT_VEC4,   glu::TYPE_INT,			glu::TYPE_INT_VEC2,
												glu::TYPE_INT_VEC3,		glu::TYPE_INT_VEC4,		glu::TYPE_UINT,
												glu::TYPE_UINT_VEC2,	glu::TYPE_UINT_VEC3,	glu::TYPE_UINT_VEC4,
												glu::TYPE_BOOL,			glu::TYPE_BOOL_VEC2,	glu::TYPE_BOOL_VEC3,
												glu::TYPE_BOOL_VEC4,	glu::TYPE_FLOAT_MAT2,   glu::TYPE_FLOAT_MAT3,
												glu::TYPE_FLOAT_MAT4,   glu::TYPE_FLOAT_MAT2X3, glu::TYPE_FLOAT_MAT2X4,
												glu::TYPE_FLOAT_MAT3X2, glu::TYPE_FLOAT_MAT3X4, glu::TYPE_FLOAT_MAT4X2,
												glu::TYPE_FLOAT_MAT4X3 };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} precisionFlags[] = { { "lowp", PRECISION_LOW }, { "mediump", PRECISION_MEDIUM }, { "highp", PRECISION_HIGH } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} layoutFlags[] = { { "shared", LAYOUT_SHARED }, { "packed", LAYOUT_PACKED }, { "std140", LAYOUT_STD140 } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} matrixFlags[] = { { "row_major", LAYOUT_ROW_MAJOR }, { "column_major", LAYOUT_COLUMN_MAJOR } };

	static const struct
	{
		const char*					 name;
		UniformBlockCase::BufferMode mode;
	} bufferModes[] = { { "per_block_buffer", UniformBlockCase::BUFFERMODE_PER_BLOCK },
						{ "single_buffer", UniformBlockCase::BUFFERMODE_SINGLE } };

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				if (glu::isDataTypeBoolOrBVec(type))
					layoutGroup->addChild(new BlockBasicTypeCase(m_context, typeName, "", m_glslVersion,
																 VarType(type, 0), flags, 0 /* no instance array */));
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, precisionFlags[precNdx].flags), flags,
							0 /* no instance array */));
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							layoutGroup->addChild(new BlockBasicTypeCase(
								m_context,
								(string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" +
								 typeName)
									.c_str(),
								"", m_glslVersion, VarType(type, precisionFlags[precNdx].flags),
								flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				const int	 arraySize = 3;
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize), flags,
					0 /* no instance array */));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(VarType(type, PRECISION_HIGH), arraySize),
							flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructGroup->addChild(new BlockSingleStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructArrayGroup->addChild(new BlockSingleStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructGroup->addChild(new BlockSingleNestedStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructArrayGroup->addChild(new BlockSingleNestedStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		   = basicTypes[basicTypeNdx];
				const char*   typeName	 = glu::getDataTypeName(type);
				const int	 numInstances = 3;
				deUint32	  baseFlags	= layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		   = baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), flags, numInstances));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, PRECISION_HIGH), flags | matrixFlags[matFlagNdx].flags,
							numInstances));
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32 allShaders	= FEATURE_VERTEX_BLOCKS | FEATURE_FRAGMENT_BLOCKS | FEATURE_SHARED_BLOCKS;
		const deUint32 allLayouts	= FEATURE_PACKED_LAYOUT | FEATURE_SHARED_LAYOUT | FEATURE_STD140_LAYOUT;
		const deUint32 allBasicTypes = FEATURE_VECTORS | FEATURE_MATRICES;
		const deUint32 unused		 = FEATURE_UNUSED_MEMBERS | FEATURE_UNUSED_UNIFORMS;
		const deUint32 matFlags		 = FEATURE_MATRIX_LAYOUT;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types", "Scalar types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders | allLayouts | unused,
							  10, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types", "Scalar and vector types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | FEATURE_VECTORS, 10, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types", "All basic types, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags, 10, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays", "Arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_ARRAYS, 10, 50);

		createRandomCaseGroup(
			randomGroup, m_context, "basic_instance_arrays", "Basic instance arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_INSTANCE_ARRAYS, 10, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs", "Nested structs, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS, 10, 100);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_arrays", "Nested structs, arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_ARRAYS, 10, 150);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_instance_arrays",
			"Nested structs, instance arrays, per-block buffers", m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_INSTANCE_ARRAYS, 10,
			125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",
							  "Nested structs, instance arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS |
								  FEATURE_ARRAYS | FEATURE_INSTANCE_ARRAYS,
							  10, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers", "All random features, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, ~0u, 20, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer", "All random features, shared buffer",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_SINGLE, ~0u, 20, 250);
	}
}